

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.h
# Opt level: O0

void __thiscall
NativeFunction::NativeFunction<Sexp*,Sexp*>(NativeFunction *this,function<Sexp_*(Sexp_*)> *wrapped)

{
  function<Sexp_*(Sexp_**)> *this_00;
  function<Sexp_*(Sexp_*)> local_38;
  function<Sexp_*(Sexp_*)> *local_18;
  function<Sexp_*(Sexp_*)> *wrapped_local;
  NativeFunction *this_local;
  
  this->arity = 1;
  local_18 = wrapped;
  wrapped_local = (function<Sexp_*(Sexp_*)> *)this;
  this_00 = (function<Sexp_*(Sexp_**)> *)operator_new(0x20);
  std::function<Sexp_*(Sexp_*)>::function(&local_38,wrapped);
  std::function<Sexp*(Sexp**)>::
  function<NativeFunction::NativeFunction<Sexp*,Sexp*>(std::function<Sexp*(Sexp*)>)::_lambda(Sexp**)_1_,void>
            ((function<Sexp*(Sexp**)> *)this_00,(anon_class_32_1_e273b765 *)&local_38);
  this->func = this_00;
  NativeFunction<Sexp*,Sexp*>(std::function<Sexp*(Sexp*)>)::{lambda(Sexp**)#1}::~function
            ((_lambda_Sexp____1_ *)&local_38);
  return;
}

Assistant:

NativeFunction(std::function<Ret(Args...)> wrapped) {
    arity = sizeof...(Args);
    func = new std::function<Sexp *(Sexp **)>([=](Sexp **args) {
      return NativeFunctionHelper(wrapped, args,
                                  std::make_index_sequence<sizeof...(Args)>{});
    });
  }